

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

bool __thiscall cmRuntimeDependencyArchive::Prepare(cmRuntimeDependencyArchive *this)

{
  cmMakefile *pcVar1;
  cmBinUtilsLinker *pcVar2;
  _func_int **pp_Var3;
  bool bVar4;
  undefined1 uVar5;
  string *psVar7;
  ostream *poVar8;
  string platform;
  string systemName;
  allocator<char> local_1c9;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostream local_188;
  int iVar6;
  
  pcVar1 = this->Command->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM",
             (allocator<char> *)&local_1c8);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_188);
  std::__cxx11::string::string((string *)&local_1a8,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_188);
  if (local_1a8._M_string_length == 0) {
    pcVar1 = this->Command->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"CMAKE_HOST_SYSTEM_NAME",&local_1c9);
    psVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_1c8);
    std::__cxx11::string::string((string *)&local_188,(string *)psVar7);
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_188,"Windows");
    if (((bVar4) ||
        (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_188,"Darwin"), bVar4)) ||
       (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_188,"Linux"), bVar4)) {
      std::__cxx11::string::assign((char *)&local_1a8);
    }
    std::__cxx11::string::~string((string *)&local_188);
  }
  bVar4 = std::operator==(&local_1a8,"linux+elf");
  if (bVar4) {
    local_1c8._M_dataplus._M_p = (pointer)this;
    std::make_unique<cmBinUtilsLinuxELFLinker,cmRuntimeDependencyArchive*>
              ((cmRuntimeDependencyArchive **)&local_188);
  }
  else {
    bVar4 = std::operator==(&local_1a8,"windows+pe");
    if (bVar4) {
      local_1c8._M_dataplus._M_p = (pointer)this;
      std::make_unique<cmBinUtilsWindowsPELinker,cmRuntimeDependencyArchive*>
                ((cmRuntimeDependencyArchive **)&local_188);
    }
    else {
      bVar4 = std::operator==(&local_1a8,"macos+macho");
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
        poVar8 = std::operator<<(&local_188,
                                 "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM: ");
        std::operator<<(poVar8,(string *)&local_1a8);
        std::__cxx11::stringbuf::str();
        SetError(this,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
        uVar5 = 0;
        goto LAB_002fa888;
      }
      local_1c8._M_dataplus._M_p = (pointer)this;
      std::make_unique<cmBinUtilsMacOSMachOLinker,cmRuntimeDependencyArchive*>
                ((cmRuntimeDependencyArchive **)&local_188);
    }
  }
  pp_Var3 = local_188._vptr_basic_ostream;
  local_188._vptr_basic_ostream = (_func_int **)0x0;
  pcVar2 = (this->Linker)._M_t.
           super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
           super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
           super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
  (this->Linker)._M_t.
  super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
  super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
  super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl = (cmBinUtilsLinker *)pp_Var3;
  if ((pcVar2 != (cmBinUtilsLinker *)0x0) &&
     ((*pcVar2->_vptr_cmBinUtilsLinker[1])(),
     (cmBinUtilsLinker *)local_188._vptr_basic_ostream != (cmBinUtilsLinker *)0x0)) {
    (**(code **)((long)*local_188._vptr_basic_ostream + 8))();
  }
  iVar6 = (*((this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl)->_vptr_cmBinUtilsLinker
            [2])();
  uVar5 = (undefined1)iVar6;
LAB_002fa888:
  std::__cxx11::string::~string((string *)&local_1a8);
  return (bool)uVar5;
}

Assistant:

bool cmRuntimeDependencyArchive::Prepare()
{
  std::string platform = this->GetMakefile()->GetSafeDefinition(
    "CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM");
  if (platform.empty()) {
    std::string systemName =
      this->GetMakefile()->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
    if (systemName == "Windows") {
      platform = "windows+pe";
    } else if (systemName == "Darwin") {
      platform = "macos+macho";
    } else if (systemName == "Linux") {
      platform = "linux+elf";
    }
  }
  if (platform == "linux+elf") {
    this->Linker = cm::make_unique<cmBinUtilsLinuxELFLinker>(this);
  } else if (platform == "windows+pe") {
    this->Linker = cm::make_unique<cmBinUtilsWindowsPELinker>(this);
  } else if (platform == "macos+macho") {
    this->Linker = cm::make_unique<cmBinUtilsMacOSMachOLinker>(this);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM: "
      << platform;
    this->SetError(e.str());
    return false;
  }

  return this->Linker->Prepare();
}